

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_vmprintf(char *zFormat,__va_list_tag *ap)

{
  int iVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  StrAccum acc;
  char zBase [70];
  sqlite3_str local_88;
  char local_68 [72];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    local_88.zText = local_68;
    local_88.db = (sqlite3 *)0x0;
    local_88.nAlloc = 0x46;
    local_88.mxAlloc = 1000000000;
    local_88.nChar = 0;
    local_88.accError = '\0';
    local_88.printfFlags = '\0';
    sqlite3_str_vappendf(&local_88,zFormat,ap);
    pcVar2 = sqlite3StrAccumFinish(&local_88);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pcVar2;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API char *sqlite3_vmprintf(const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zFormat==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return 0;
#endif
  sqlite3StrAccumInit(&acc, 0, zBase, sizeof(zBase), SQLITE_MAX_LENGTH);
  sqlite3_str_vappendf(&acc, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  return z;
}